

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distributivity.cpp
# Opt level: O1

void __thiscall
duckdb::DistributivityRule::DistributivityRule
          (DistributivityRule *this,ExpressionRewriter *rewriter)

{
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var3;
  pointer pEVar4;
  pointer *__ptr;
  
  (this->super_Rule).rewriter = rewriter;
  this_00 = &(this->super_Rule).root;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_02476578;
  _Var2._M_head_impl = (ExpressionMatcher *)operator_new(0x20);
  (_Var2._M_head_impl)->_vptr_ExpressionMatcher = (_func_int **)&PTR__ExpressionMatcher_024760f0;
  (_Var2._M_head_impl)->expr_class = INVALID;
  ((_Var2._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       = (unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )0x0;
  ((_Var2._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_> =
       (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  (this_00->
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>)._M_t
  .super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var2._M_head_impl;
  _Var3._M_head_impl = (ExpressionTypeMatcher *)operator_new(0x10);
  (_Var3._M_head_impl)->_vptr_ExpressionTypeMatcher =
       (_func_int **)&PTR__ExpressionTypeMatcher_02476b30;
  *(undefined1 *)&_Var3._M_head_impl[1]._vptr_ExpressionTypeMatcher = 0x33;
  pEVar4 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(this_00);
  _Var1._M_head_impl =
       (pEVar4->expr_type).
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pEVar4->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
    return;
  }
  return;
}

Assistant:

DistributivityRule::DistributivityRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// we match on an OR expression within a LogicalFilter node
	root = make_uniq<ExpressionMatcher>();
	root->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::CONJUNCTION_OR);
}